

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Error TT_Get_MM_Var(TT_Face face,FT_MM_Var **master)

{
  FT_Stream pFVar1;
  GX_Blend pGVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  char cVar5;
  FT_UShort FVar6;
  FT_Error FVar7;
  uint uVar8;
  FT_MM_Var *pFVar9;
  FT_Var_Axis *pFVar10;
  GX_Blend pGVar11;
  FT_Fixed *pFVar12;
  FT_ULong FVar13;
  FT_Var_Named_Style *pFVar14;
  FT_String *pFVar15;
  FT_Fixed *pFVar16;
  ulong uVar17;
  FT_UInt FVar18;
  long lVar19;
  FT_Offset size;
  long lVar20;
  FT_Memory memory;
  FT_Var_Named_Style *pFVar21;
  ulong uVar22;
  char *pcVar23;
  uint uVar24;
  long lVar25;
  FT_UInt num_coords;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  FT_Error error;
  FT_Int dummy2;
  GX_FVar_Head fvar_head;
  FT_ULong table_len;
  GX_FVar_Axis axis_rec;
  FT_Error local_f8;
  byte local_f1;
  ulong local_f0;
  FT_Var_Named_Style *local_e8;
  uint local_dc;
  FT_Stream local_d8;
  undefined1 local_cc [4];
  FT_MM_Var *local_c8;
  ulong local_c0;
  ulong local_b8;
  FT_Memory local_b0;
  long local_a8;
  ulong local_a0;
  FT_MM_Var **local_98;
  long local_90;
  undefined1 local_88 [8];
  ushort local_80;
  ushort local_7e;
  ushort local_7a;
  ushort local_78;
  FT_ULong local_70;
  FT_ULong local_68;
  FT_Fixed *local_60;
  FT_ULong local_58;
  FT_Fixed local_50;
  FT_Fixed FStack_48;
  FT_Fixed local_40;
  undefined2 local_38;
  ushort local_36;
  long lVar29;
  
  memory = (face->root).memory;
  pFVar1 = (face->root).stream;
  local_f8 = 0;
  pGVar2 = face->blend;
  if (pGVar2 == (GX_Blend)0x0) {
    local_f8 = (*face->goto_table)(face,0x67766172,pFVar1,&local_70);
    if ((local_f8 != 0) &&
       (local_f8 = (*face->goto_table)(face,0x43464632,pFVar1,&local_70), local_f8 != 0)) {
      return local_f8;
    }
    local_f8 = (*face->goto_table)(face,0x66766172,pFVar1,&local_70);
    if (local_f8 != 0) {
      return local_f8;
    }
    local_e8 = (FT_Var_Named_Style *)FT_Stream_Pos(pFVar1);
    local_f8 = FT_Stream_ReadFields(pFVar1,TT_Get_MM_Var::fvar_fields,local_88);
    if (local_f8 != 0) {
      return local_f8;
    }
    local_f0 = CONCAT44(local_f0._4_4_,(uint)local_78);
    local_c0 = (ulong)local_7e;
    pGVar11 = (GX_Blend)ft_mem_alloc(memory,0x90,&local_f8);
    face->blend = pGVar11;
    if (local_f8 != 0) {
      return local_f8;
    }
    bVar26 = (int)local_c0 * 4 + 6 != (int)local_f0;
    num_coords = (FT_UInt)local_7e;
  }
  else {
    num_coords = pGVar2->num_axis;
    bVar26 = true;
    local_e8 = (FT_Var_Named_Style *)0x0;
    pGVar11 = pGVar2;
  }
  uVar8 = (uint)(face->root).style_flags;
  uVar24 = uVar8 >> 0x10;
  local_f0 = (ulong)num_coords;
  uVar22 = local_f0 * 2 + 7 & 0xfffffffffffffff8;
  lVar19 = local_f0 * 0x10;
  local_c0 = (ulong)(uVar24 << 4);
  local_90 = (ulong)(uVar24 * num_coords) * 8;
  lVar20 = local_f0 * 0x30;
  local_d8 = pFVar1;
  local_98 = master;
  if (pGVar2 != (GX_Blend)0x0) goto LAB_0016be18;
  size = local_90 + (ulong)(num_coords * 5) + lVar20 + local_c0 + uVar22 + 0x20;
  pGVar11->mmvar_len = size;
  local_f1 = bVar26;
  local_dc = uVar24;
  local_b8 = (ulong)(uVar24 * num_coords);
  local_b0 = memory;
  local_a8 = lVar20;
  local_a0 = uVar22;
  local_c8 = (FT_MM_Var *)ft_mem_alloc(memory,size,&local_f8);
  pFVar1 = local_d8;
  if (local_f8 != 0) {
    return local_f8;
  }
  face->blend->mmvar = local_c8;
  local_c8->num_axis = num_coords;
  local_c8->num_designs = 0xffffffff;
  local_c8->num_namedstyles = local_dc;
  pFVar10 = (FT_Var_Axis *)((long)&local_c8[1].num_axis + local_a0);
  local_c8->axis = pFVar10;
  pFVar14 = (FT_Var_Named_Style *)((long)&pFVar10->name + local_a8);
  local_c8->namedstyle = pFVar14;
  if (0xffff < uVar8) {
    uVar22 = (ulong)(local_dc + (local_dc == 0));
    pFVar12 = (FT_Fixed *)((long)&local_c8[1].num_axis + local_a8 + local_c0 + local_a0);
    pFVar21 = pFVar14;
    do {
      pFVar21->coords = pFVar12;
      pFVar21 = pFVar21 + 1;
      pFVar12 = pFVar12 + local_f0;
      uVar22 = uVar22 - 1;
    } while (uVar22 != 0);
  }
  auVar4 = _DAT_00187030;
  if (num_coords != 0) {
    lVar25 = (long)&pFVar14->coords + local_90 + local_c0;
    lVar20 = local_f0 - 1;
    auVar27._8_4_ = (int)lVar20;
    auVar27._0_8_ = lVar20;
    auVar27._12_4_ = (int)((ulong)lVar20 >> 0x20);
    lVar20 = 0;
    auVar27 = auVar27 ^ _DAT_00187030;
    auVar28 = _DAT_0018d5f0;
    do {
      auVar30._8_4_ = (int)lVar25;
      auVar30._0_8_ = lVar25;
      auVar30._12_4_ = (int)((ulong)lVar25 >> 0x20);
      auVar31 = auVar28 ^ auVar4;
      if ((bool)(~(auVar31._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar31._0_4_ ||
                  auVar27._4_4_ < auVar31._4_4_) & 1)) {
        *(long *)((long)&local_c8[1].num_axis + lVar20 + local_a0) = lVar25;
      }
      if ((auVar31._12_4_ != auVar27._12_4_ || auVar31._8_4_ <= auVar27._8_4_) &&
          auVar31._12_4_ <= auVar27._12_4_) {
        *(long *)((long)&local_c8[2].axis + lVar20 + local_a0) = auVar30._8_8_ + 5;
      }
      lVar29 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 2;
      auVar28._8_8_ = lVar29 + 2;
      lVar25 = lVar25 + 10;
      lVar20 = lVar20 + 0x60;
    } while ((lVar19 + 0x10U & 0xffffffffffffffe0) * 3 != lVar20);
  }
  FVar7 = FT_Stream_Seek(local_d8,(long)&local_e8->coords + (ulong)local_80);
  pFVar9 = local_c8;
  if (FVar7 != 0) {
    return FVar7;
  }
  if (num_coords != 0) {
    pFVar10 = local_c8->axis;
    lVar20 = 0;
    do {
      local_f8 = 0;
      FVar7 = FT_Stream_ReadFields(pFVar1,TT_Get_MM_Var::fvaraxis_fields,&local_58);
      if (FVar7 != 0) {
        return FVar7;
      }
      pFVar10->tag = local_58;
      pFVar10->minimum = local_50;
      pFVar10->def = FStack_48;
      pFVar10->maximum = local_40;
      pFVar10->strid = (uint)local_36;
      *pFVar10->name = (FT_String)(local_58 >> 0x18);
      pFVar10->name[1] = *(FT_String *)((long)&pFVar10->tag + 2);
      pFVar10->name[2] = *(FT_String *)((long)&pFVar10->tag + 1);
      pFVar10->name[3] = (FT_String)pFVar10->tag;
      pFVar10->name[4] = '\0';
      *(undefined2 *)((long)&pFVar9[1].num_axis + lVar20 * 2) = local_38;
      lVar19 = pFVar10->def;
      if ((lVar19 < pFVar10->minimum) || (pFVar10->maximum < lVar19)) {
        pFVar10->minimum = lVar19;
        pFVar10->maximum = lVar19;
      }
      pFVar10 = pFVar10 + 1;
      lVar20 = lVar20 + 1;
    } while ((int)local_f0 != (int)lVar20);
  }
  local_f8 = 0;
  pFVar12 = (FT_Fixed *)ft_mem_realloc(local_b0,8,0,local_b8,(void *)0x0,&local_f8);
  pFVar1 = local_d8;
  pGVar2 = face->blend;
  pGVar2->normalized_stylecoords = pFVar12;
  if (local_f8 != 0) {
    return local_f8;
  }
  if (local_7a == 0) {
    uVar8 = 0;
    uVar22 = local_f0;
  }
  else {
    FVar7 = local_f8;
    if (pGVar2->avar_loaded == '\0') {
      FVar13 = FT_Stream_Pos(local_d8);
      ft_var_load_avar(face);
      FVar7 = FT_Stream_Seek(pFVar1,FVar13);
      if (FVar7 != 0) {
        return FVar7;
      }
      uVar8 = 0;
      local_f8 = 0;
      uVar22 = local_f0;
      FVar7 = 0;
      if (local_7a == 0) goto LAB_0016c47d;
    }
    local_f8 = FVar7;
    uVar22 = local_f0;
    pFVar12 = face->blend->normalized_stylecoords;
    local_e8 = local_c8->namedstyle;
    local_68 = (ulong)((uint)(local_f1 ^ 1) * 2) + local_f0 * 4 + 4;
    uVar17 = 0;
    local_d8 = pFVar1;
    do {
      pFVar1 = local_d8;
      local_b8 = uVar17;
      local_f8 = FT_Stream_EnterFrame(local_d8,local_68);
      if (local_f8 != 0) {
        return local_f8;
      }
      local_60 = pFVar12;
      FVar6 = FT_Stream_GetUShort(pFVar1);
      local_e8->strid = (uint)FVar6;
      FT_Stream_GetUShort(pFVar1);
      if (num_coords != 0) {
        pFVar12 = local_e8->coords;
        lVar20 = 0;
        do {
          FVar13 = FT_Stream_GetULong(pFVar1);
          pFVar12[lVar20] = FVar13;
          lVar20 = lVar20 + 1;
        } while ((int)uVar22 != (int)lVar20);
      }
      pFVar12 = local_60;
      uVar17 = local_b8;
      uVar8 = 0xffff;
      if (local_f1 == 0) {
        FVar6 = FT_Stream_GetUShort(pFVar1);
        uVar8 = (uint)FVar6;
      }
      pFVar14 = local_e8;
      local_e8->psid = uVar8;
      ft_var_to_normalized((TT_Face)face->blend,num_coords,local_e8->coords,pFVar12);
      pFVar12 = pFVar12 + uVar22;
      FT_Stream_ExitFrame(local_d8);
      uVar24 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar24;
      local_e8 = pFVar14 + 1;
      uVar8 = (uint)local_7a;
    } while (uVar24 < local_7a);
  }
LAB_0016c47d:
  if (local_dc != uVar8) {
    pvVar3 = face->sfnt;
    FVar18 = 0x11;
    cVar5 = (**(code **)((long)pvVar3 + 0xf0))(face,0x11,&local_58,local_cc);
    if (cVar5 == '\0') {
      FVar18 = 2;
      cVar5 = (**(code **)((long)pvVar3 + 0xf0))(face,2,&local_58,local_cc);
      if (cVar5 == '\0') goto LAB_0016c545;
    }
    cVar5 = (**(code **)((long)pvVar3 + 0xf0))(face,6,&local_58,local_cc);
    if (cVar5 != '\0') {
      pFVar14 = local_c8->namedstyle;
      uVar17 = (ulong)local_7a;
      pFVar14[uVar17].strid = FVar18;
      pFVar14[uVar17].psid = 6;
      if (num_coords != 0) {
        pFVar12 = pFVar14[uVar17].coords;
        pFVar16 = &local_c8->axis->def;
        lVar20 = 0;
        do {
          pFVar12[lVar20] = *pFVar16;
          lVar20 = lVar20 + 1;
          pFVar16 = pFVar16 + 6;
        } while ((int)uVar22 != (int)lVar20);
      }
    }
  }
LAB_0016c545:
  ft_var_load_mvar(face);
  memory = local_b0;
  uVar22 = local_a0;
  lVar20 = local_a8;
LAB_0016be18:
  if ((local_98 != (FT_MM_Var **)0x0) &&
     (pFVar9 = (FT_MM_Var *)ft_mem_alloc(memory,face->blend->mmvar_len,&local_f8), local_f8 == 0)) {
    memcpy(pFVar9,face->blend->mmvar,face->blend->mmvar_len);
    pFVar10 = (FT_Var_Axis *)((long)&pFVar9[1].num_axis + uVar22);
    pFVar9->axis = pFVar10;
    pFVar14 = (FT_Var_Named_Style *)((long)&pFVar9[1].num_axis + lVar20 + uVar22);
    pFVar9->namedstyle = pFVar14;
    uVar17 = (ulong)pFVar9->num_namedstyles;
    if (uVar17 != 0) {
      pFVar12 = (FT_Fixed *)((long)&pFVar9[1].num_axis + lVar20 + local_c0 + uVar22);
      pFVar21 = pFVar14;
      do {
        pFVar21->coords = pFVar12;
        pFVar21 = pFVar21 + 1;
        pFVar12 = pFVar12 + local_f0;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    if (num_coords != 0) {
      pFVar15 = (FT_String *)((long)&pFVar14->coords + local_90 + local_c0);
      do {
        pFVar10->name = pFVar15;
        FVar13 = pFVar10->tag;
        if ((long)FVar13 < 0x77647468) {
          if (FVar13 == 0x6f70737a) {
            pcVar23 = "OpticalSize";
            goto LAB_0016bf26;
          }
          if (FVar13 == 0x736c6e74) {
            pcVar23 = "Slant";
            goto LAB_0016bf26;
          }
        }
        else {
          pcVar23 = "Weight";
          if (FVar13 != 0x77676874) {
            if (FVar13 != 0x77647468) goto LAB_0016bf29;
            pcVar23 = "Width";
          }
LAB_0016bf26:
          pFVar10->name = pcVar23;
        }
LAB_0016bf29:
        pFVar15 = pFVar15 + 5;
        pFVar10 = pFVar10 + 1;
        num_coords = num_coords - 1;
      } while (num_coords != 0);
    }
    *local_98 = pFVar9;
  }
  return local_f8;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Get_MM_Var( TT_Face      face,
                 FT_MM_Var*  *master )
  {
    FT_Stream            stream     = face->root.stream;
    FT_Memory            memory     = face->root.memory;
    FT_ULong             table_len;
    FT_Error             error      = FT_Err_Ok;
    FT_ULong             fvar_start = 0;
    FT_UInt              i, j;
    FT_MM_Var*           mmvar = NULL;
    FT_Fixed*            next_coords;
    FT_Fixed*            nsc;
    FT_String*           next_name;
    FT_Var_Axis*         a;
    FT_Fixed*            c;
    FT_Var_Named_Style*  ns;
    GX_FVar_Head         fvar_head;
    FT_Bool              usePsName  = 0;
    FT_UInt              num_instances;
    FT_UInt              num_axes;
    FT_UShort*           axis_flags;

    FT_Offset  mmvar_size;
    FT_Offset  axis_flags_size;
    FT_Offset  axis_size;
    FT_Offset  namedstyle_size;
    FT_Offset  next_coords_size;
    FT_Offset  next_name_size;

    FT_Bool  need_init;

    static const FT_Frame_Field  fvar_fields[] =
    {

#undef  FT_STRUCTURE
#define FT_STRUCTURE  GX_FVar_Head

      FT_FRAME_START( 16 ),
        FT_FRAME_LONG      ( version ),
        FT_FRAME_USHORT    ( offsetToData ),
        FT_FRAME_SKIP_SHORT,
        FT_FRAME_USHORT    ( axisCount ),
        FT_FRAME_USHORT    ( axisSize ),
        FT_FRAME_USHORT    ( instanceCount ),
        FT_FRAME_USHORT    ( instanceSize ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  fvaraxis_fields[] =
    {

#undef  FT_STRUCTURE
#define FT_STRUCTURE  GX_FVar_Axis

      FT_FRAME_START( 20 ),
        FT_FRAME_ULONG ( axisTag ),
        FT_FRAME_LONG  ( minValue ),
        FT_FRAME_LONG  ( defaultValue ),
        FT_FRAME_LONG  ( maxValue ),
        FT_FRAME_USHORT( flags ),
        FT_FRAME_USHORT( nameID ),
      FT_FRAME_END
    };


    /* read the font data and set up the internal representation */
    /* if not already done                                       */

    need_init = !face->blend;

    if ( need_init )
    {
      FT_TRACE2(( "FVAR " ));

      /* both `fvar' and `gvar' must be present */
      if ( FT_SET_ERROR( face->goto_table( face, TTAG_gvar,
                                           stream, &table_len ) ) )
      {
        /* CFF2 is an alternate to gvar here */
        if ( FT_SET_ERROR( face->goto_table( face, TTAG_CFF2,
                                             stream, &table_len ) ) )
        {
          FT_TRACE1(( "\n"
                      "TT_Get_MM_Var: `gvar' or `CFF2' table is missing\n" ));
          goto Exit;
        }
      }

      if ( FT_SET_ERROR( face->goto_table( face, TTAG_fvar,
                                           stream, &table_len ) ) )
      {
        FT_TRACE1(( "is missing\n" ));
        goto Exit;
      }

      fvar_start = FT_STREAM_POS( );

      /* the validity of the `fvar' header data was already checked */
      /* in function `sfnt_init_face'                               */
      if ( FT_STREAM_READ_FIELDS( fvar_fields, &fvar_head ) )
        goto Exit;

      usePsName = FT_BOOL( fvar_head.instanceSize ==
                           6 + 4 * fvar_head.axisCount );

      FT_TRACE2(( "loaded\n" ));

      FT_TRACE5(( "number of GX style axes: %d\n", fvar_head.axisCount ));

      if ( FT_NEW( face->blend ) )
        goto Exit;

      num_axes = fvar_head.axisCount;
    }
    else
      num_axes = face->blend->num_axis;

    /* `num_instances' holds the number of all named instances, */
    /* including the default instance which might be missing    */
    /* in fvar's table of named instances                       */
    num_instances = (FT_UInt)face->root.style_flags >> 16;

    /* prepare storage area for MM data; this cannot overflow   */
    /* 32-bit arithmetic because of the size limits used in the */
    /* `fvar' table validity check in `sfnt_init_face'          */

    /* the various `*_size' variables, which we also use as     */
    /* offsets into the `mmlen' array, must be multiples of the */
    /* pointer size (except the last one); without such an      */
    /* alignment there might be runtime errors due to           */
    /* misaligned addresses                                     */
#undef  ALIGN_SIZE
#define ALIGN_SIZE( n ) \
          ( ( (n) + sizeof (void*) - 1 ) & ~( sizeof (void*) - 1 ) )

    mmvar_size       = ALIGN_SIZE( sizeof ( FT_MM_Var ) );
    axis_flags_size  = ALIGN_SIZE( num_axes *
                                   sizeof ( FT_UShort ) );
    axis_size        = ALIGN_SIZE( num_axes *
                                   sizeof ( FT_Var_Axis ) );
    namedstyle_size  = ALIGN_SIZE( num_instances *
                                   sizeof ( FT_Var_Named_Style ) );
    next_coords_size = ALIGN_SIZE( num_instances *
                                   num_axes *
                                   sizeof ( FT_Fixed ) );
    next_name_size   = num_axes * 5;

    if ( need_init )
    {
      face->blend->mmvar_len = mmvar_size       +
                               axis_flags_size  +
                               axis_size        +
                               namedstyle_size  +
                               next_coords_size +
                               next_name_size;

      if ( FT_ALLOC( mmvar, face->blend->mmvar_len ) )
        goto Exit;
      face->blend->mmvar = mmvar;

      /* set up pointers and offsets into the `mmvar' array; */
      /* the data gets filled in later on                    */

      mmvar->num_axis =
        num_axes;
      mmvar->num_designs =
        ~0U;                   /* meaningless in this context; each glyph */
                               /* may have a different number of designs  */
                               /* (or tuples, as called by Apple)         */
      mmvar->num_namedstyles =
        num_instances;

      /* alas, no public field in `FT_Var_Axis' for axis flags */
      axis_flags =
        (FT_UShort*)( (char*)mmvar + mmvar_size );
      mmvar->axis =
        (FT_Var_Axis*)( (char*)axis_flags + axis_flags_size );
      mmvar->namedstyle =
        (FT_Var_Named_Style*)( (char*)mmvar->axis + axis_size );

      next_coords = (FT_Fixed*)( (char*)mmvar->namedstyle +
                                 namedstyle_size );
      for ( i = 0; i < num_instances; i++ )
      {
        mmvar->namedstyle[i].coords  = next_coords;
        next_coords                 += num_axes;
      }

      next_name = (FT_String*)( (char*)mmvar->namedstyle +
                                namedstyle_size + next_coords_size );
      for ( i = 0; i < num_axes; i++ )
      {
        mmvar->axis[i].name  = next_name;
        next_name           += 5;
      }

      /* now fill in the data */

      if ( FT_STREAM_SEEK( fvar_start + fvar_head.offsetToData ) )
        goto Exit;

      a = mmvar->axis;
      for ( i = 0; i < num_axes; i++ )
      {
        GX_FVar_Axis  axis_rec;


        if ( FT_STREAM_READ_FIELDS( fvaraxis_fields, &axis_rec ) )
          goto Exit;
        a->tag     = axis_rec.axisTag;
        a->minimum = axis_rec.minValue;
        a->def     = axis_rec.defaultValue;
        a->maximum = axis_rec.maxValue;
        a->strid   = axis_rec.nameID;

        a->name[0] = (FT_String)(   a->tag >> 24 );
        a->name[1] = (FT_String)( ( a->tag >> 16 ) & 0xFF );
        a->name[2] = (FT_String)( ( a->tag >>  8 ) & 0xFF );
        a->name[3] = (FT_String)( ( a->tag       ) & 0xFF );
        a->name[4] = '\0';

        *axis_flags = axis_rec.flags;

        if ( a->minimum > a->def ||
             a->def > a->maximum )
        {
          FT_TRACE2(( "TT_Get_MM_Var:"
                      " invalid \"%s\" axis record; disabling\n",
                      a->name ));

          a->minimum = a->def;
          a->maximum = a->def;
        }

        FT_TRACE5(( "  \"%s\":"
                    " minimum=%.5f, default=%.5f, maximum=%.5f,"
                    " flags=0x%04X\n",
                    a->name,
                    a->minimum / 65536.0,
                    a->def / 65536.0,
                    a->maximum / 65536.0,
                    *axis_flags ));

        a++;
        axis_flags++;
      }

      FT_TRACE5(( "\n" ));

      /* named instance coordinates are stored as design coordinates; */
      /* we have to convert them to normalized coordinates also       */
      if ( FT_NEW_ARRAY( face->blend->normalized_stylecoords,
                         num_axes * num_instances ) )
        goto Exit;

      if ( fvar_head.instanceCount && !face->blend->avar_loaded )
      {
        FT_ULong  offset = FT_STREAM_POS();


        ft_var_load_avar( face );

        if ( FT_STREAM_SEEK( offset ) )
          goto Exit;
      }

      ns  = mmvar->namedstyle;
      nsc = face->blend->normalized_stylecoords;
      for ( i = 0; i < fvar_head.instanceCount; i++, ns++ )
      {
        /* PostScript names add 2 bytes to the instance record size */
        if ( FT_FRAME_ENTER( ( usePsName ? 6L : 4L ) +
                             4L * num_axes ) )
          goto Exit;

        ns->strid       =    FT_GET_USHORT();
        (void) /* flags = */ FT_GET_USHORT();

        c = ns->coords;
        for ( j = 0; j < num_axes; j++, c++ )
          *c = FT_GET_LONG();

        /* valid psid values are 6, [256;32767], and 0xFFFF */
        if ( usePsName )
          ns->psid = FT_GET_USHORT();
        else
          ns->psid = 0xFFFF;

        ft_var_to_normalized( face, num_axes, ns->coords, nsc );
        nsc += num_axes;

        FT_FRAME_EXIT();
      }

      if ( num_instances != fvar_head.instanceCount )
      {
        SFNT_Service  sfnt = (SFNT_Service)face->sfnt;

        FT_Int   found, dummy1, dummy2;
        FT_UInt  strid = ~0U;


        /* the default instance is missing in array the   */
        /* of named instances; try to synthesize an entry */
        found = sfnt->get_name_id( face,
                                   TT_NAME_ID_TYPOGRAPHIC_SUBFAMILY,
                                   &dummy1,
                                   &dummy2 );
        if ( found )
          strid = TT_NAME_ID_TYPOGRAPHIC_SUBFAMILY;
        else
        {
          found = sfnt->get_name_id( face,
                                     TT_NAME_ID_FONT_SUBFAMILY,
                                     &dummy1,
                                     &dummy2 );
          if ( found )
            strid = TT_NAME_ID_FONT_SUBFAMILY;
        }

        if ( found )
        {
          found = sfnt->get_name_id( face,
                                     TT_NAME_ID_PS_NAME,
                                     &dummy1,
                                     &dummy2 );
          if ( found )
          {
            FT_TRACE5(( "TT_Get_MM_Var:"
                        " Adding default instance to named instances\n" ));

            ns = &mmvar->namedstyle[fvar_head.instanceCount];

            ns->strid = strid;
            ns->psid  = TT_NAME_ID_PS_NAME;

            a = mmvar->axis;
            c = ns->coords;
            for ( j = 0; j < num_axes; j++, a++, c++ )
              *c = a->def;
          }
        }
      }

      ft_var_load_mvar( face );
    }

    /* fill the output array if requested */

    if ( master )
    {
      FT_UInt  n;


      if ( FT_ALLOC( mmvar, face->blend->mmvar_len ) )
        goto Exit;
      FT_MEM_COPY( mmvar, face->blend->mmvar, face->blend->mmvar_len );

      axis_flags =
        (FT_UShort*)( (char*)mmvar + mmvar_size );
      mmvar->axis =
        (FT_Var_Axis*)( (char*)axis_flags + axis_flags_size );
      mmvar->namedstyle =
        (FT_Var_Named_Style*)( (char*)mmvar->axis+ axis_size );

      next_coords = (FT_Fixed*)( (char*)mmvar->namedstyle +
                                 namedstyle_size );
      for ( n = 0; n < mmvar->num_namedstyles; n++ )
      {
        mmvar->namedstyle[n].coords  = next_coords;
        next_coords                 += num_axes;
      }

      a         = mmvar->axis;
      next_name = (FT_String*)( (char*)mmvar->namedstyle +
                                namedstyle_size + next_coords_size );
      for ( n = 0; n < num_axes; n++ )
      {
        a->name = next_name;

        /* standard PostScript names for some standard apple tags */
        if ( a->tag == TTAG_wght )
          a->name = (char*)"Weight";
        else if ( a->tag == TTAG_wdth )
          a->name = (char*)"Width";
        else if ( a->tag == TTAG_opsz )
          a->name = (char*)"OpticalSize";
        else if ( a->tag == TTAG_slnt )
          a->name = (char*)"Slant";

        next_name += 5;
        a++;
      }

      *master = mmvar;
    }

  Exit:
    return error;
  }